

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int smooth_(int *n,double *x,double *y,double *w,double *span,int *iper,double *vsmlsq,double *smo,
           double *acvr)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  
  iVar6 = iabs(*iper);
  uVar5 = *n;
  uVar9 = (uint)((double)(int)uVar5 * *span * 0.5 + 0.5);
  uVar13 = 2;
  if (2 < (int)uVar9) {
    uVar13 = uVar9;
  }
  uVar10 = uVar13 * 2 + 1;
  uVar12 = 0;
  uVar9 = 0;
  if (iVar6 == 2) {
    uVar9 = ~uVar13;
  }
  if (0 < (int)uVar10) {
    uVar12 = (ulong)uVar10;
  }
  lVar11 = (long)(int)uVar5;
  iVar17 = uVar9 + uVar5;
  iVar14 = 1;
  dVar27 = 0.0;
  dVar21 = 0.0;
  dVar23 = 0.0;
  dVar29 = 0.0;
  lVar7 = (long)(int)uVar9;
  dVar28 = 0.0;
  while( true ) {
    iVar17 = iVar17 + 1;
    bVar19 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar19) break;
    if (lVar7 + 1 < 1) {
      dVar24 = x[lVar11 + lVar7] + -1.0;
      iVar18 = iVar17;
    }
    else {
      dVar24 = x[lVar7];
      iVar18 = iVar14 + uVar9;
    }
    dVar31 = w[(long)iVar18 + -1];
    dVar22 = dVar28 + dVar31;
    if (0.0 < dVar22) {
      dVar21 = (dVar21 * dVar28 + dVar31 * y[(long)iVar18 + -1]) / dVar22;
    }
    dVar27 = (double)(~-(ulong)(0.0 < dVar22) & (ulong)dVar27 |
                     (ulong)((dVar28 * dVar27 + dVar24 * dVar31) / dVar22) & -(ulong)(0.0 < dVar22))
    ;
    dVar28 = (double)(-(ulong)(0.0 < dVar28) &
                     (ulong)((dVar31 * dVar22 * (dVar24 - dVar27)) / dVar28));
    dVar23 = dVar23 + (dVar24 - dVar27) * dVar28;
    dVar29 = dVar29 + (y[(long)iVar18 + -1] - dVar21) * dVar28;
    iVar14 = iVar14 + 1;
    lVar7 = lVar7 + 1;
    dVar28 = dVar22;
  }
  uVar12 = (ulong)uVar13;
  uVar8 = 0;
  if (0 < (int)uVar5) {
    uVar8 = (ulong)uVar5;
  }
  lVar7 = (long)(int)-uVar13;
  uVar15 = 1;
  do {
    if (uVar15 - uVar8 == 1) {
      iVar6 = 1;
      do {
        iVar14 = iVar6;
        if (iVar6 < (int)uVar5) {
          uVar8 = (ulong)iVar6;
          dVar21 = w[uVar8 - 1];
          dVar29 = smo[uVar8 - 1] * dVar21;
          uVar12 = uVar8;
          dVar28 = x[uVar8 - 1];
          do {
            pdVar1 = x + uVar12;
            if (dVar28 < *pdVar1) goto LAB_001301b0;
            pdVar2 = w + uVar12;
            pdVar3 = smo + uVar12;
            uVar12 = uVar12 + 1;
            dVar29 = dVar29 + *pdVar3 * *pdVar2;
            dVar21 = dVar21 + *pdVar2;
            dVar28 = *pdVar1;
          } while ((long)uVar12 < lVar11);
          uVar12 = (ulong)uVar5;
LAB_001301b0:
          iVar14 = (int)uVar12;
          if (iVar6 < iVar14) {
            for (; (long)uVar8 <= (long)iVar14; uVar8 = uVar8 + 1) {
              smo[uVar8 - 1] = (double)(-(ulong)(0.0 < dVar21) & (ulong)(dVar29 / dVar21));
            }
          }
        }
        iVar6 = iVar14 + 1;
        if ((int)uVar5 <= iVar14) {
          return iVar6;
        }
      } while( true );
    }
    iVar14 = (int)uVar15;
    lVar16 = lVar7 + uVar15 + -1;
    if (iVar6 == 2) {
      if (lVar16 < 1) {
        iVar17 = (uVar5 - uVar13) + iVar14 + -1;
        dVar24 = x[lVar11 + lVar7 + (uVar15 - 2)] + -1.0;
LAB_0012ff0e:
        dVar31 = x[uVar12 + (uVar15 - 1)];
        uVar9 = uVar13;
      }
      else {
LAB_0012fed3:
        iVar17 = ~uVar13 + iVar14;
        if ((long)(uVar12 + uVar15) <= lVar11) {
          dVar24 = x[lVar7 + (uVar15 - 2)];
          goto LAB_0012ff0e;
        }
        dVar31 = x[(uVar12 + (uVar15 - 1)) - lVar11] + 1.0;
        dVar24 = x[lVar7 + (uVar15 - 2)];
        uVar9 = uVar13 - uVar5;
      }
      dVar22 = w[(long)iVar17 + -1];
      dVar26 = dVar28 - dVar22;
      dVar25 = dVar27;
      dVar32 = dVar21;
      if (0.0 < dVar26) {
        dVar25 = (dVar28 * dVar27 - dVar24 * dVar22) / dVar26;
        dVar32 = (dVar28 * dVar21 - y[(long)iVar17 + -1] * dVar22) / dVar26;
      }
      dVar4 = w[(long)(int)(iVar14 + uVar9) + -1];
      dVar30 = dVar26 + dVar4;
      if (0.0 < dVar30) {
        dVar32 = (dVar32 * dVar26 + dVar4 * y[(long)(int)(iVar14 + uVar9) + -1]) / dVar30;
      }
      dVar24 = dVar24 - dVar27;
      dVar27 = (double)(~-(ulong)(0.0 < dVar30) & (ulong)dVar25 |
                       (ulong)((dVar26 * dVar25 + dVar31 * dVar4) / dVar30) & -(ulong)(0.0 < dVar30)
                       );
      uVar20 = -(ulong)(0.0 < dVar26);
      dVar25 = (double)((ulong)((dVar4 * dVar30 * (dVar31 - dVar27)) / dVar26) & uVar20);
      dVar28 = (double)(~uVar20 & 0x8000000000000000 |
                       (ulong)((dVar22 * -dVar28 * dVar24) / dVar26) & uVar20);
      dVar23 = (dVar31 - dVar27) * dVar25 + dVar24 * dVar28 + dVar23;
      dVar29 = (y[(long)(int)(iVar14 + uVar9) + -1] - dVar32) * dVar25 +
               (y[(long)iVar17 + -1] - dVar21) * dVar28 + dVar29;
      dVar21 = dVar32;
      dVar28 = dVar30;
    }
    else if ((long)(uVar12 + uVar15) <= lVar11 && (lVar7 + uVar15 != 1 && -1 < lVar16))
    goto LAB_0012fed3;
    smo[uVar15 - 1] =
         (x[uVar15 - 1] - dVar27) * (double)(-(ulong)(*vsmlsq < dVar23) & (ulong)(dVar29 / dVar23))
         + dVar21;
    if (0 < *iper) {
      dVar24 = (double)(-(ulong)(0.0 < dVar28) & (ulong)(1.0 / dVar28));
      if (*vsmlsq <= dVar23 && dVar23 != *vsmlsq) {
        dVar24 = dVar24 + ((x[uVar15 - 1] - dVar27) * (x[uVar15 - 1] - dVar27)) / dVar23;
      }
      acvr[uVar15 - 1] = 0.0;
      dVar24 = 1.0 - dVar24 * w[uVar15 - 1];
      if (dVar24 <= 0.0) {
        if (uVar15 < 2) goto LAB_0013014d;
        dVar24 = acvr[uVar15 - 2];
      }
      else {
        dVar24 = ABS(y[uVar15 - 1] - smo[uVar15 - 1]) / dVar24;
      }
      acvr[uVar15 - 1] = dVar24;
    }
LAB_0013014d:
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

static int smooth_(int *n, double *x, double *y, double *w, double *span, int *iper, double *vsmlsq, double *smo, double *acvr)
{
    /* System generated locals */
    int i__1;
    double r__1;
    double d__1;

    /* Local variables */
    double a, h__;
    int i__, j, j0, in, it;
    double xm, ym, wt, sy, fbo, fbw;
    int ibw;
    double var, tmp;
    double xti;
    int out;
    double xto;
    double cvar;
    int jper;

    /* Parameter adjustments */
    --acvr;
    --smo;
    --w;
    --y;
    --x;

    /* Function Body */
    xm = 0.f;
    ym = xm;
    var = ym;
    cvar = var;
    fbw = cvar;
    jper = iabs(*iper);
    ibw = *span * .5 * *n + .5;
    if (ibw < 2) {
	ibw = 2;
    }
    it = (ibw << 1) + 1;
    i__1 = it;
    for (i__ = 1; i__ <= i__1; ++i__) {
	j = i__;
	if (jper == 2) {
	    j = i__ - ibw - 1;
	}
	xti = x[j];
	if (j >= 1) {
	    goto L10;
	}
	j = *n + j;
	xti = x[j] - 1.0;
L10:
	wt = w[j];
	fbo = fbw;
	fbw += wt;
	if (fbw > 0.0) {
	    xm = (fbo * xm + wt * xti) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym + wt * y[j]) / fbw;
	}
	tmp = 0.0;
	if (fbo > 0.0) {
	    tmp = fbw * wt * (xti - xm) / fbo;
	}
	var += tmp * (xti - xm);
	cvar += tmp * (y[j] - ym);
/* L20: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	out = j - ibw - 1;
	in = j + ibw;
	if (jper != 2 && (out < 1 || in > *n)) {
	    goto L60;
	}
	if (out >= 1) {
	    goto L30;
	}
	out = *n + out;
	xto = x[out] - 1.0;
	xti = x[in];
	goto L50;
L30:
	if (in <= *n) {
	    goto L40;
	}
	in -= *n;
	xti = x[in] + 1.0;
	xto = x[out];
	goto L50;
L40:
	xto = x[out];
	xti = x[in];
L50:
	wt = w[out];
	fbo = fbw;
	fbw -= wt;
	tmp = 0.0;
	if (fbw > 0.0) {
	    tmp = fbo * wt * (xto - xm) / fbw;
	}
	var -= tmp * (xto - xm);
	cvar -= tmp * (y[out] - ym);
	if (fbw > 0.0) {
	    xm = (fbo * xm - wt * xto) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym - wt * y[out]) / fbw;
	}
	wt = w[in];
	fbo = fbw;
	fbw += wt;
	if (fbw > 0.0) {
	    xm = (fbo * xm + wt * xti) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym + wt * y[in]) / fbw;
	}
	tmp = 0.0;
	if (fbo > 0.0) {
	    tmp = fbw * wt * (xti - xm) / fbo;
	}
	var += tmp * (xti - xm);
	cvar += tmp * (y[in] - ym);
L60:
	a = 0.0;
	if (var > *vsmlsq) {
	    a = cvar / var;
	}
	smo[j] = a * (x[j] - xm) + ym;
	if (*iper <= 0) {
	    goto L80;
	}
	h__ = 0.0;
	if (fbw > 0.0) {
	    h__ = 1.0 / fbw;
	}
	if (var > *vsmlsq) {
/* Computing 2nd power */
	    d__1 = x[j] - xm;
	    h__ += d__1 * d__1 / var;
	}
	acvr[j] = 0.0;
	a = 1.0 - w[j] * h__;
	if (a <= 0.0) {
	    goto L70;
	}
	acvr[j] = (r__1 = y[j] - smo[j], fabs(r__1)) / a;
	goto L80;
L70:
	if (j <= 1) {
	    goto L80;
	}
	acvr[j] = acvr[j - 1];
L80:
	;
    }
    j = 1;
L90:
    j0 = j;
    sy = smo[j] * w[j];
    fbw = w[j];
    if (j >= *n) {
	goto L110;
    }
L100:
    if (x[j + 1] > x[j]) {
	goto L110;
    }
    ++j;
    sy += w[j] * smo[j];
    fbw += w[j];
    if (j < *n) {
	goto L100;
    }
L110:
    if (j <= j0) {
	goto L130;
    }
    a = 0.0;
    if (fbw > 0.0) {
	a = sy / fbw;
    }
    i__1 = j;
    for (i__ = j0; i__ <= i__1; ++i__) {
	smo[i__] = a;
/* L120: */
    }
L130:
    ++j;
    if (j <= *n) {
	goto L90;
    }
    return 0;
}